

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O0

void Abc_RRManStop(Abc_RRMan_t *p)

{
  Abc_RRMan_t *p_local;
  
  Abc_RRManClean(p);
  Vec_PtrFree(p->vFaninLeaves);
  Vec_PtrFree(p->vFanoutRoots);
  Vec_PtrFree(p->vLeaves);
  Vec_PtrFree(p->vCone);
  Vec_PtrFree(p->vRoots);
  if (p->pParams != (Prove_Params_t *)0x0) {
    free(p->pParams);
    p->pParams = (Prove_Params_t *)0x0;
  }
  if (p != (Abc_RRMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Abc_RRManStop( Abc_RRMan_t * p )
{
    Abc_RRManClean( p );
    Vec_PtrFree( p->vFaninLeaves  );  
    Vec_PtrFree( p->vFanoutRoots  );  
    Vec_PtrFree( p->vLeaves );  
    Vec_PtrFree( p->vCone );  
    Vec_PtrFree( p->vRoots );  
    ABC_FREE( p->pParams );
    ABC_FREE( p );
}